

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

int __thiscall
CEditor::UiDoValueSelector
          (CEditor *this,void *pID,CUIRect *pRect,char *pLabel,int Current,int Min,int Max,int Step,
          float Scale,char *pToolTip)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  float fVar3;
  undefined8 uVar4;
  char aBuf [128];
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CUIRect::Inside(pRect,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
  if ((this->m_UI).m_pActiveItem == pID) {
    (this->m_UI).m_ActiveItemValid = true;
    if ((((this->m_UI).m_MouseButtons & 1) == 0) ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1b,0),
       (char)iVar2 != '\0')) {
      this->m_LockMouse = false;
      (this->m_UI).m_ActiveItemValid = true;
      (this->m_UI).m_pActiveItem = (void *)0x0;
    }
    else {
      iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
      if (((char)iVar2 == '\0') &&
         (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165),
         (char)iVar2 == '\0')) {
        fVar3 = this->m_MouseDeltaX;
      }
      else {
        fVar3 = this->m_MouseDeltaX * 0.05;
      }
      UiDoValueSelector::s_Value = fVar3 + UiDoValueSelector::s_Value;
      fVar3 = -UiDoValueSelector::s_Value;
      if (-UiDoValueSelector::s_Value <= UiDoValueSelector::s_Value) {
        fVar3 = UiDoValueSelector::s_Value;
      }
      if (Scale < fVar3) {
        fVar3 = UiDoValueSelector::s_Value / Scale;
        UiDoValueSelector::s_Value = (float)FUN_00113d40();
        Current = (int)fVar3 * Step + Current;
        if (Current <= Min) {
          Current = Min;
        }
        if (Max <= Current) {
          Current = Max;
        }
      }
    }
  }
  else {
    if ((this->m_UI).m_pHotItem != pID) goto LAB_00193ea8;
    if (((this->m_UI).m_MouseButtons & 1) != 0) {
      this->m_LockMouse = true;
      UiDoValueSelector::s_Value = 0.0;
      (this->m_UI).m_ActiveItemValid = true;
      (this->m_UI).m_pActiveItem = pID;
      if (pID != (void *)0x0) {
        (this->m_UI).m_pLastActiveItem = pID;
      }
    }
  }
  if (pToolTip != (char *)0x0) {
    this->m_pTooltip = pToolTip;
  }
LAB_00193ea8:
  if (bVar1) {
    (this->m_UI).m_pBecommingHotItem = pID;
  }
  str_format(local_b8,0x80,"%s %d",pLabel,(ulong)(uint)Current);
  if ((this->m_UI).m_pHotItem == pID) {
    uVar4 = 0x3f4000003f800000;
  }
  else {
    uVar4 = 0x3f0000003f800000;
  }
  uStack_c0 = (undefined4)uVar4;
  uStack_bc = (undefined4)((ulong)uVar4 >> 0x20);
  local_c8.x = 1.0;
  uStack_c4 = 0x3f800000;
  CUIRect::Draw(pRect,(vec4 *)&local_c8,5.0,0xf);
  pRect->y = pRect->h * 0.5 + -7.0 + pRect->y;
  CUI::DoLabel(&this->m_UI,pRect,local_b8,10.0,1,-1.0,true);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return Current;
}

Assistant:

int CEditor::UiDoValueSelector(void *pID, CUIRect *pRect, const char *pLabel, int Current, int Min, int Max, int Step, float Scale, const char *pToolTip)
{
	// logic
	static float s_Value;
	bool Inside = UI()->MouseInside(pRect);

	if(UI()->CheckActiveItem(pID))
	{
		if(!UI()->MouseButton(0) || Input()->KeyPress(KEY_ESCAPE))
		{
			m_LockMouse = false;
			UI()->SetActiveItem(0);
		}
		else
		{
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
				s_Value += m_MouseDeltaX*0.05f;
			else
				s_Value += m_MouseDeltaX;

			if(absolute(s_Value) > Scale)
			{
				int Count = (int)(s_Value/Scale);
				s_Value = fmod(s_Value, Scale);
				Current += Step*Count;
				if(Current < Min)
					Current = Min;
				if(Current > Max)
					Current = Max;
			}
		}
		if(pToolTip)
			m_pTooltip = pToolTip;
	}
	else if(UI()->HotItem() == pID)
	{
		if(UI()->MouseButton(0))
		{
			m_LockMouse = true;
			s_Value = 0;
			UI()->SetActiveItem(pID);
		}
		if(pToolTip)
			m_pTooltip = pToolTip;
	}

	if(Inside)
		UI()->SetHotItem(pID);

	// render
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf),"%s %d", pLabel, Current);
	pRect->Draw(GetButtonColor(pID, 0));
	pRect->y += pRect->h/2.0f-7.0f;
	UI()->DoLabel(pRect, aBuf, 10, TEXTALIGN_CENTER);

	return Current;
}